

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O2

void * __thiscall mjs::gc_heap_ptr_untyped::get(gc_heap_ptr_untyped *this)

{
  slot *psVar1;
  
  if (this->heap_ != (gc_heap *)0x0) {
    psVar1 = gc_heap::allocation_context::get_at(&this->heap_->alloc_context_,this->pos_);
    return psVar1;
  }
  __assert_fail("heap_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1a2,"void *mjs::gc_heap_ptr_untyped::get() const");
}

Assistant:

void* get() const {
        assert(heap_);
        return heap().get_at(pos_);
    }